

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

bool __thiscall svg::Document::save(Document *this)

{
  byte bVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream local_218 [8];
  ofstream ofs;
  Document *this_local;
  
  uVar2 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_218,uVar2,0x10);
  bVar1 = std::ios::good();
  bVar3 = (bVar1 & 1) != 0;
  if (bVar3) {
    writeToStream(this,local_218);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_218);
  return bVar3;
}

Assistant:

bool save() const
        {
            std::ofstream ofs(file_name.c_str());
            if (!ofs.good())
                return false;

            writeToStream(ofs);
            ofs.close();
            return true;
        }